

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_SHA1_Hash * __thiscall
ON_SubDHash::SubDHash(ON_SHA1_Hash *__return_storage_ptr__,ON_SubDHash *this)

{
  ON_SHA1 sha1;
  ON_SHA1 local_98;
  
  local_98.m_state[2] = 0;
  local_98.m_state[3] = 0;
  local_98.m_state[4] = 0;
  local_98.m_bit_count[0] = 0;
  local_98.m_bit_count[1] = 0;
  local_98.m_state[0] = 0;
  local_98.m_state[1] = 0;
  local_98.m_buffer[0x30] = '\0';
  local_98.m_buffer[0x31] = '\0';
  local_98.m_buffer[0x32] = '\0';
  local_98.m_buffer[0x33] = '\0';
  local_98.m_buffer[0x34] = '\0';
  local_98.m_buffer[0x35] = '\0';
  local_98.m_buffer[0x36] = '\0';
  local_98.m_buffer[0x37] = '\0';
  local_98.m_buffer[0x38] = '\0';
  local_98.m_buffer[0x39] = '\0';
  local_98.m_buffer[0x3a] = '\0';
  local_98.m_buffer[0x3b] = '\0';
  local_98.m_buffer[0x3c] = '\0';
  local_98.m_buffer[0x3d] = '\0';
  local_98.m_buffer[0x3e] = '\0';
  local_98.m_buffer[0x3f] = '\0';
  local_98.m_buffer[0x20] = '\0';
  local_98.m_buffer[0x21] = '\0';
  local_98.m_buffer[0x22] = '\0';
  local_98.m_buffer[0x23] = '\0';
  local_98.m_buffer[0x24] = '\0';
  local_98.m_buffer[0x25] = '\0';
  local_98.m_buffer[0x26] = '\0';
  local_98.m_buffer[0x27] = '\0';
  local_98.m_buffer[0x28] = '\0';
  local_98.m_buffer[0x29] = '\0';
  local_98.m_buffer[0x2a] = '\0';
  local_98.m_buffer[0x2b] = '\0';
  local_98.m_buffer[0x2c] = '\0';
  local_98.m_buffer[0x2d] = '\0';
  local_98.m_buffer[0x2e] = '\0';
  local_98.m_buffer[0x2f] = '\0';
  local_98.m_buffer[0x10] = '\0';
  local_98.m_buffer[0x11] = '\0';
  local_98.m_buffer[0x12] = '\0';
  local_98.m_buffer[0x13] = '\0';
  local_98.m_buffer[0x14] = '\0';
  local_98.m_buffer[0x15] = '\0';
  local_98.m_buffer[0x16] = '\0';
  local_98.m_buffer[0x17] = '\0';
  local_98.m_buffer[0x18] = '\0';
  local_98.m_buffer[0x19] = '\0';
  local_98.m_buffer[0x1a] = '\0';
  local_98.m_buffer[0x1b] = '\0';
  local_98.m_buffer[0x1c] = '\0';
  local_98.m_buffer[0x1d] = '\0';
  local_98.m_buffer[0x1e] = '\0';
  local_98.m_buffer[0x1f] = '\0';
  local_98.m_buffer[0] = '\0';
  local_98.m_buffer[1] = '\0';
  local_98.m_buffer[2] = '\0';
  local_98.m_buffer[3] = '\0';
  local_98.m_buffer[4] = '\0';
  local_98.m_buffer[5] = '\0';
  local_98.m_buffer[6] = '\0';
  local_98.m_buffer[7] = '\0';
  local_98.m_buffer[8] = '\0';
  local_98.m_buffer[9] = '\0';
  local_98.m_buffer[10] = '\0';
  local_98.m_buffer[0xb] = '\0';
  local_98.m_buffer[0xc] = '\0';
  local_98.m_buffer[0xd] = '\0';
  local_98.m_buffer[0xe] = '\0';
  local_98.m_buffer[0xf] = '\0';
  local_98.m_byte_count = 0;
  local_98.m_status_bits = 0;
  local_98.m_reserved = 0;
  ON_SHA1_Hash::ON_SHA1_Hash(&local_98.m_sha1_hash);
  if (this->m_vertex_count != 0) {
    ON_SHA1::AccumulateInteger32(&local_98,this->m_vertex_count);
  }
  if (this->m_edge_count != 0) {
    ON_SHA1::AccumulateInteger32(&local_98,this->m_edge_count);
  }
  if (this->m_face_count != 0) {
    ON_SHA1::AccumulateInteger32(&local_98,this->m_face_count);
  }
  if (this->m_hash_type != Unset) {
    if (this->m_vertex_count != 0) {
      ON_SHA1::AccumulateSubHash(&local_98,&this->m_vertex_hash);
    }
    if (this->m_edge_count != 0) {
      ON_SHA1::AccumulateSubHash(&local_98,&this->m_edge_hash);
    }
    if (this->m_face_count != 0) {
      ON_SHA1::AccumulateSubHash(&local_98,&this->m_face_hash);
    }
  }
  ON_SHA1::Hash(__return_storage_ptr__,&local_98);
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_SubDHash::SubDHash() const
{
  ON_SHA1 sha1;
  if (m_vertex_count > 0)
    sha1.AccumulateInteger32(m_vertex_count);
  if (m_edge_count > 0)
    sha1.AccumulateInteger32(m_edge_count);
  if (m_face_count > 0)
    sha1.AccumulateInteger32(m_face_count);
  if (ON_SubDHashType::Unset != m_hash_type)
  {
    if (m_vertex_count > 0)
      sha1.AccumulateSubHash(m_vertex_hash);
    if (m_edge_count > 0)
      sha1.AccumulateSubHash(m_edge_hash);
    if (m_face_count > 0)
      sha1.AccumulateSubHash(m_face_hash);
  }
  return sha1.Hash();
}